

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O0

void density::f_default_construct::invoke<density_tests::Derived2>(void *i_dest)

{
  void *i_dest_local;
  
  memset(i_dest,0,0x30);
  density_tests::Derived2::Derived2((Derived2 *)i_dest);
  return;
}

Assistant:

static void invoke(void * i_dest)
        {
            DENSITY_ASSUME(i_dest != nullptr);
            new (i_dest) TARGET_TYPE();
        }